

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O1

void UnityAssertGreaterOrLessOrEqualNumber
               (UNITY_INT threshold,UNITY_INT actual,UNITY_COMPARISON_T compare,char *msg,
               UNITY_UINT lineNumber,UNITY_DISPLAY_STYLE_T style)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  if ((Unity.CurrentTestIgnored == 0 && Unity.CurrentTestFailed == 0) &&
     ((threshold == actual & (byte)compare) == 0)) {
    bVar3 = (style & 0x10) == 0;
    bVar2 = threshold <= actual;
    if (bVar3) {
      bVar2 = (ulong)threshold <= (ulong)actual;
    }
    bVar1 = actual <= threshold;
    if (bVar3) {
      bVar1 = (ulong)actual <= (ulong)threshold;
    }
    if ((((byte)(~bVar2 & (byte)((compare & UNITY_GREATER_THAN) >> 1)) != 0) ||
        (!(bool)(bVar1 | (compare & UNITY_SMALLER_THAN) == UNITY_WITHIN))) || (threshold == actual))
    {
      UnityTestResultsFailBegin(lineNumber);
      UnityPrint(" Expected ");
      UnityPrintNumberByStyle(actual,style);
      if ((compare & UNITY_GREATER_THAN) != UNITY_WITHIN) {
        UnityPrint(" to be greater than ");
      }
      if ((compare & UNITY_SMALLER_THAN) != UNITY_WITHIN) {
        UnityPrint(" to be less than ");
      }
      if ((compare & UNITY_EQUAL_TO) != UNITY_WITHIN) {
        UnityPrint("or equal to ");
      }
      UnityPrintNumberByStyle(threshold,style);
      UnityAddMsgIfSpecified(msg);
      Unity.CurrentTestFailed = 1;
      longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
    }
  }
  return;
}

Assistant:

void UnityAssertGreaterOrLessOrEqualNumber(const UNITY_INT threshold,
                                           const UNITY_INT actual,
                                           const UNITY_COMPARISON_T compare,
                                           const char *msg,
                                           const UNITY_LINE_TYPE lineNumber,
                                           const UNITY_DISPLAY_STYLE_T style)
{
    int failed = 0;
    RETURN_IF_FAIL_OR_IGNORE;

    if (threshold == actual && compare & UNITY_EQUAL_TO) return;
    if (threshold == actual) failed = 1;

    if ((style & UNITY_DISPLAY_RANGE_INT) == UNITY_DISPLAY_RANGE_INT)
    {
        if (actual > threshold && compare & UNITY_SMALLER_THAN) failed = 1;
        if (actual < threshold && compare & UNITY_GREATER_THAN) failed = 1;
    }
    else /* UINT or HEX */
    {
        if ((UNITY_UINT)actual > (UNITY_UINT)threshold && compare & UNITY_SMALLER_THAN) failed = 1;
        if ((UNITY_UINT)actual < (UNITY_UINT)threshold && compare & UNITY_GREATER_THAN) failed = 1;
    }

    if (failed)
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrint(UnityStrExpected);
        UnityPrintNumberByStyle(actual, style);
        if (compare & UNITY_GREATER_THAN) UnityPrint(UnityStrGt);
        if (compare & UNITY_SMALLER_THAN) UnityPrint(UnityStrLt);
        if (compare & UNITY_EQUAL_TO)     UnityPrint(UnityStrOrEqual);
        UnityPrintNumberByStyle(threshold, style);
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }
}